

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O2

uint32_t FAudioFXReverb_IsOutputFormatSupported
                   (FAPOBase *fapo,FAudioWaveFormatEx *pInputFormat,
                   FAudioWaveFormatEx *pRequestedOutputFormat,
                   FAudioWaveFormatEx **ppSupportedOutputFormat)

{
  int8_t iVar1;
  ushort uVar2;
  FAudioWaveFormatEx *pFVar3;
  uint32_t uVar4;
  
  uVar4 = 0;
  if (((pInputFormat->nSamplesPerSec != pRequestedOutputFormat->nSamplesPerSec) &&
      (uVar4 = 1, ppSupportedOutputFormat != (FAudioWaveFormatEx **)0x0)) &&
     (*ppSupportedOutputFormat != (FAudioWaveFormatEx *)0x0)) {
    (*ppSupportedOutputFormat)->nSamplesPerSec = pInputFormat->nSamplesPerSec;
  }
  iVar1 = IsFloatFormat(pRequestedOutputFormat);
  if (((iVar1 == '\0') && (uVar4 = 1, ppSupportedOutputFormat != (FAudioWaveFormatEx **)0x0)) &&
     (*ppSupportedOutputFormat != (FAudioWaveFormatEx *)0x0)) {
    (*ppSupportedOutputFormat)->wFormatTag = 3;
  }
  uVar2 = pInputFormat->nChannels;
  if (uVar2 - 1 < 2) {
    if (pRequestedOutputFormat->nChannels == 6 || pRequestedOutputFormat->nChannels == uVar2) {
      return uVar4;
    }
    if (ppSupportedOutputFormat == (FAudioWaveFormatEx **)0x0) {
      return 1;
    }
    pFVar3 = *ppSupportedOutputFormat;
  }
  else if (uVar2 == 6) {
    if (pRequestedOutputFormat->nChannels == 6) {
      return uVar4;
    }
    if (ppSupportedOutputFormat == (FAudioWaveFormatEx **)0x0) {
      return 1;
    }
    pFVar3 = *ppSupportedOutputFormat;
    uVar2 = 6;
  }
  else {
    if (ppSupportedOutputFormat == (FAudioWaveFormatEx **)0x0) {
      return 1;
    }
    pFVar3 = *ppSupportedOutputFormat;
    uVar2 = 1;
  }
  if (pFVar3 != (FAudioWaveFormatEx *)0x0) {
    pFVar3->nChannels = uVar2;
  }
  return 1;
}

Assistant:

uint32_t FAudioFXReverb_IsOutputFormatSupported(
	FAPOBase *fapo,
	const FAudioWaveFormatEx *pInputFormat,
	const FAudioWaveFormatEx *pRequestedOutputFormat,
	FAudioWaveFormatEx **ppSupportedOutputFormat
) {
	uint32_t result = 0;

#define SET_SUPPORTED_FIELD(field, value)	\
	result = 1;	\
	if (ppSupportedOutputFormat && *ppSupportedOutputFormat)	\
	{	\
		(*ppSupportedOutputFormat)->field = (value);	\
	}

	/* Sample Rate */
	if (pInputFormat->nSamplesPerSec != pRequestedOutputFormat->nSamplesPerSec)
	{
		SET_SUPPORTED_FIELD(nSamplesPerSec, pInputFormat->nSamplesPerSec);
	}

	/* Data Type */
	if (!IsFloatFormat(pRequestedOutputFormat))
	{
		SET_SUPPORTED_FIELD(wFormatTag, FAUDIO_FORMAT_IEEE_FLOAT);
	}

	/* Input/Output Channel Count */
	if (pInputFormat->nChannels == 1 || pInputFormat->nChannels == 2)
	{
		if (	pRequestedOutputFormat->nChannels != pInputFormat->nChannels &&
			pRequestedOutputFormat->nChannels != 6)
		{
			SET_SUPPORTED_FIELD(nChannels, pInputFormat->nChannels);
		}
	}
	else if (pInputFormat->nChannels == 6)
	{
		if (pRequestedOutputFormat->nChannels != 6)
		{
			SET_SUPPORTED_FIELD(nChannels, pInputFormat->nChannels);
		}
	}
	else
	{
		SET_SUPPORTED_FIELD(nChannels, 1);
	}

#undef SET_SUPPORTED_FIELD

	return result;
}